

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

axbStatus_t op_vec_norm2(axbVec_s *x,axbScalar_s *norm,void *aux_data)

{
  double dVar1;
  double *pdVar2;
  size_t sVar3;
  double dVar4;
  
  dVar4 = 0.0;
  if (x->size != 0) {
    sVar3 = 0;
    do {
      dVar1 = *(double *)((long)x->data + sVar3 * 8);
      dVar4 = dVar4 + dVar1 * dVar1;
      sVar3 = sVar3 + 1;
    } while (x->size != sVar3);
  }
  pdVar2 = (double *)norm->data;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  *pdVar2 = dVar4;
  return 0;
}

Assistant:

static axbStatus_t op_vec_norm2(const struct axbVec_s *x, struct axbScalar_s *norm, void *aux_data)
{
  (void)aux_data;

  const double *d_x    = (const double*)x->data;
        double *d_norm =       (double*)norm->data;

  double n = 0;
  for (size_t i=0; i<x->size; ++i) n += d_x[i] * d_x[i];
  *d_norm = sqrt(n);

  return 0;
}